

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall sim_ternary_Test::sim_ternary_Test(sim_ternary_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002ab280;
  return;
}

Assistant:

TEST(sim, ternary) {    // NOLINT
    Context ctx;
    auto &gen = ctx.generator("mod");
    auto &a = gen.var("a", 1);
    auto &b = gen.var("b", 16);
    auto &c = gen.var("c", 16);
    Simulator sim(&gen);
    sim.set(&a, 0);
    sim.set(&b, 42);
    sim.set(&c, 25);
    auto cond = ConditionalExpr(a.shared_from_this(), b.shared_from_this(), c.shared_from_this());
    auto result = (*sim.eval_expr(&cond))[0];
    EXPECT_EQ(result, 25);
    sim.set(&a, 1);
    result = (*sim.eval_expr(&cond))[0];
    EXPECT_EQ(result, 42);
}